

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O3

void read_vec_element_i32
               (TCGContext_conflict12 *tcg_ctx,TCGv_i32 dst,uint8_t reg,uint8_t enr,
               MemOp_conflict memop)

{
  byte bVar1;
  
  if (reg < 0x20) {
    bVar1 = (byte)memop & 3;
    tcg_gen_op3_s390x(tcg_ctx,*(TCGOpcode *)(&DAT_00dc1224 + (long)(int)memop * 4),
                      (TCGArg)(dst + (long)tcg_ctx),(TCGArg)(tcg_ctx->cpu_env + (long)tcg_ctx),
                      (ulong)((uint)reg * 0x10 + ((uint)enr << bVar1 ^ (-1 << bVar1) + 8U) + 0x80));
    return;
  }
  g_assertion_message_expr
            ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/s390x/translate.c"
             ,0xdf,"reg < 32");
}

Assistant:

static void read_vec_element_i32(DisasContext *s, TCGv_i32 tcg_dest, int srcidx,
                                 int element, MemOp memop)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int vect_off = vec_reg_offset(s, srcidx, element, memop & MO_SIZE);
    switch (memop) {
    case MO_8:
        tcg_gen_ld8u_i32(tcg_ctx, tcg_dest, tcg_ctx->cpu_env, vect_off);
        break;
    case MO_16:
        tcg_gen_ld16u_i32(tcg_ctx, tcg_dest, tcg_ctx->cpu_env, vect_off);
        break;
    case MO_8|MO_SIGN:
        tcg_gen_ld8s_i32(tcg_ctx, tcg_dest, tcg_ctx->cpu_env, vect_off);
        break;
    case MO_16|MO_SIGN:
        tcg_gen_ld16s_i32(tcg_ctx, tcg_dest, tcg_ctx->cpu_env, vect_off);
        break;
    case MO_32:
    case MO_32|MO_SIGN:
        tcg_gen_ld_i32(tcg_ctx, tcg_dest, tcg_ctx->cpu_env, vect_off);
        break;
    default:
        g_assert_not_reached();
    }
}